

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

int LTnum(TValue *l,TValue *r)

{
  double f;
  int iVar1;
  lua_Number lf;
  lua_Integer li;
  TValue *r_local;
  TValue *l_local;
  
  if (l->tt_ == 0x13) {
    if (r->tt_ == 0x13) {
      l_local._4_4_ = (uint)((l->value_).i < (r->value_).i);
    }
    else {
      l_local._4_4_ = LTintfloat((l->value_).i,(r->value_).n);
    }
  }
  else {
    f = (l->value_).n;
    if (r->tt_ == 3) {
      l_local._4_4_ = (uint)(f < (r->value_).n);
    }
    else if (NAN(f)) {
      l_local._4_4_ = 0;
    }
    else {
      iVar1 = LEintfloat((r->value_).i,f);
      l_local._4_4_ = (uint)((iVar1 != 0 ^ 0xffU) & 1);
    }
  }
  return l_local._4_4_;
}

Assistant:

static int LTnum (const TValue *l, const TValue *r) {
  if (ttisinteger(l)) {
    lua_Integer li = ivalue(l);
    if (ttisinteger(r))
      return li < ivalue(r);  /* both are integers */
    else  /* 'l' is int and 'r' is float */
      return LTintfloat(li, fltvalue(r));  /* l < r ? */
  }
  else {
    lua_Number lf = fltvalue(l);  /* 'l' must be float */
    if (ttisfloat(r))
      return luai_numlt(lf, fltvalue(r));  /* both are float */
    else if (luai_numisnan(lf))  /* 'r' is int and 'l' is float */
      return 0;  /* NaN < i is always false */
    else  /* without NaN, (l < r)  <-->  not(r <= l) */
      return !LEintfloat(ivalue(r), lf);  /* not (r <= l) ? */
  }
}